

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

int nng_url_sprintf(char *str,size_t size,nng_url *url)

{
  char *__s1;
  char *__s;
  uint16_t uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char local_44 [8];
  char portstr [8];
  undefined4 uStack_34;
  
  __s1 = url->u_scheme;
  __s = url->u_hostname;
  iVar2 = strcmp(__s1,"ipc");
  if ((((iVar2 != 0) && (iVar2 = strcmp(__s1,"inproc"), iVar2 != 0)) &&
      (iVar2 = strcmp(__s1,"unix"), iVar2 != 0)) &&
     ((iVar2 = strcmp(__s1,"abstract"), iVar2 != 0 && (iVar2 = strcmp(__s1,"socket"), iVar2 != 0))))
  {
    stack0xffffffffffffffc8 = (char *)CONCAT44(uStack_34,url->u_port);
    uVar1 = nni_url_default_port(__s1);
    portstr._0_4_ = ZEXT24(uVar1);
    pcVar3 = strchr(__s,0x3a);
    pcVar5 = "[";
    if (pcVar3 == (char *)0x0) {
      pcVar5 = "";
    }
    pcVar4 = "]";
    if (pcVar3 == (char *)0x0) {
      pcVar4 = "";
    }
    if (portstr._4_4_ == portstr._0_4_) {
      local_44[0] = '\0';
    }
    else {
      snprintf(local_44,8,":%u",(ulong)stack0xffffffffffffffc8 & 0xffffffff,pcVar5);
    }
    pcVar3 = url->u_query;
    register0x00000000 = "?";
    if (pcVar3 == (char *)0x0) {
      register0x00000000 = "";
      pcVar3 = "";
    }
    pcVar6 = url->u_fragment;
    pcVar7 = "#";
    if (pcVar6 == (char *)0x0) {
      pcVar7 = "";
      pcVar6 = "";
    }
    iVar2 = snprintf(str,size,"%s://%s%s%s%s%s%s%s%s%s",__s1,pcVar5,__s,pcVar4,local_44,url->u_path,
                     unique0x10000140,pcVar3,pcVar7,pcVar6);
    return iVar2;
  }
  iVar2 = snprintf(str,size,"%s://%s",__s1,url->u_path);
  return iVar2;
}

Assistant:

int
nng_url_sprintf(char *str, size_t size, const nng_url *url)
{
	const char *scheme  = url->u_scheme;
	const char *host    = url->u_hostname;
	const char *hostob  = "";
	const char *hostcb  = "";
	bool        do_port = true;

	if ((strcmp(scheme, "ipc") == 0) || (strcmp(scheme, "inproc") == 0) ||
	    (strcmp(scheme, "unix") == 0) ||
	    (strcmp(scheme, "abstract") == 0) ||
	    (strcmp(scheme, "socket") == 0)) {
		return (snprintf(str, size, "%s://%s", scheme, url->u_path));
	}

	if (url->u_port == nni_url_default_port(scheme)) {
		do_port = false;
	}
	if (strchr(host, ':') != 0) {
		hostob = "[";
		hostcb = "]";
	}
	char portstr[8];
	if (do_port) {
		snprintf(portstr, sizeof(portstr), ":%u", url->u_port);
	} else {
		portstr[0] = 0;
	}
	return (snprintf(str, size, "%s://%s%s%s%s%s%s%s%s%s", scheme, hostob,
	    host, hostcb, portstr, url->u_path,
	    url->u_query != NULL ? "?" : "",
	    url->u_query != NULL ? url->u_query : "",
	    url->u_fragment != NULL ? "#" : "",
	    url->u_fragment != NULL ? url->u_fragment : ""));
}